

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_file_cache.cpp
# Opt level: O1

void __thiscall duckdb::ExternalFileCache::CachedFile::CachedFile(CachedFile *this,string *path_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  paVar1 = &(this->path).field_2;
  (this->path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (path_p->_M_dataplus)._M_p;
  paVar2 = &path_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&path_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path).field_2 + 8) = uVar5;
  }
  else {
    (this->path)._M_dataplus._M_p = pcVar4;
    (this->path).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->path)._M_string_length = path_p->_M_string_length;
  (path_p->_M_dataplus)._M_p = (pointer)paVar2;
  path_p->_M_string_length = 0;
  (path_p->field_2)._M_local_buf[0] = '\0';
  StorageLock::StorageLock(&this->lock);
  p_Var3 = &(this->ranges)._M_t._M_impl.super__Rb_tree_header;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->version_tag)._M_dataplus._M_p = (pointer)&(this->version_tag).field_2;
  (this->version_tag)._M_string_length = 0;
  (this->version_tag).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ExternalFileCache::CachedFile::CachedFile(string path_p) : path(std::move(path_p)) {
}